

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O2

OperatorResultType
duckdb::UnnestFunction
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  OperatorResultType OVar1;
  GlobalTableFunctionState *pGVar2;
  LocalTableFunctionState *pLVar3;
  type state_p;
  
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pLVar3 = optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  state_p = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>::
            operator*((unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                       *)(pLVar3 + 1));
  OVar1 = PhysicalUnnest::ExecuteInternal
                    (context,input,output,state_p,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)(pGVar2 + 1),false);
  return OVar1;
}

Assistant:

static OperatorResultType UnnestFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                         DataChunk &output) {
	auto &state = data_p.global_state->Cast<UnnestGlobalState>();
	auto &lstate = data_p.local_state->Cast<UnnestLocalState>();
	return PhysicalUnnest::ExecuteInternal(context, input, output, *lstate.operator_state, state.select_list, false);
}